

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O3

uint32_t __thiscall
event_track::EventMessageInstanceBox::parse
          (EventMessageInstanceBox *this,char *ptr,uint data_size,uint64_t pres_time)

{
  pointer *ppuVar1;
  size_type sVar2;
  iterator __position;
  uint uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  allocator local_49;
  string local_48;
  undefined7 uStack_47;
  undefined1 local_38 [16];
  
  uVar3 = 0;
  if (8 < data_size) {
    fmp4_stream::full_box::parse(&this->super_full_box,ptr);
    uVar4 = fmp4_stream::box::size((box *)this);
    uVar3 = *(uint *)(ptr + uVar4 + 4);
    *(uint *)&(this->super_full_box).field_0x6c =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar6 = *(ulong *)(ptr + uVar4 + 8);
    this->presentation_time_delta_ =
         uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    uVar3 = *(uint *)(ptr + uVar4 + 0x10);
    this->event_duration_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(ptr + uVar4 + 0x14);
    this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    std::__cxx11::string::string(&local_48,ptr + uVar4 + 0x18,&local_49);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,&local_48);
    if ((undefined1 *)CONCAT71(uStack_47,local_48) != local_38) {
      operator_delete((undefined1 *)CONCAT71(uStack_47,local_48));
    }
    sVar2 = (this->scheme_id_uri_)._M_string_length;
    std::__cxx11::string::string(&local_48,ptr + uVar4 + sVar2 + 0x19,&local_49);
    std::__cxx11::string::operator=((string *)&this->value_,&local_48);
    if ((undefined1 *)CONCAT71(uStack_47,local_48) != local_38) {
      operator_delete((undefined1 *)CONCAT71(uStack_47,local_48));
    }
    uVar3 = (this->super_full_box).super_box.size_;
    uVar5 = (int)(this->value_)._M_string_length + (int)uVar4 + (int)sVar2 + 0x1a;
    if (uVar5 < uVar3) {
      uVar6 = (ulong)uVar5;
      do {
        local_48 = *(string *)(ptr + uVar6);
        __position._M_current =
             (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(&this->message_data_,__position,(uchar *)&local_48);
        }
        else {
          *__position._M_current = (uchar)local_48;
          ppuVar1 = &(this->message_data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar6 = uVar6 + 1;
        uVar3 = (this->super_full_box).super_box.size_;
      } while (uVar6 < uVar3);
    }
  }
  return uVar3;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t pres_time=0)
		{
			if (data_size > 8) 
			{
				fmp4_stream::full_box::parse(ptr);
				uint64_t offset = full_box::size();

				reserved_ = fmp4_read_uint32(ptr + offset);
				//cout << "timescale: " << timescale << endl;
				offset += 4;
				presentation_time_delta_ = fmp4_read_uint64(ptr + offset);
				//cout << "presentation time: " << presentation_time << endl;
				offset += 8;
				event_duration_ = fmp4_read_uint32(ptr + offset);
				//cout << "event duration: " << event_duration << endl;
				offset += 4;
				id_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
				//cout << "id: " << id << endl;
				scheme_id_uri_ = std::string(ptr + offset);
				offset = offset + scheme_id_uri_.size() + 1;
				//cout << "scheme_id_uri: " << scheme_id_uri << endl;
				value_ = std::string(ptr + offset);
				//cout << "value: " << value << endl;
				offset = offset + value_.size() + 1;

				for (unsigned int i = (unsigned int)offset; i < size_; i++)
					message_data_.push_back(*(ptr + (size_t)i));

				return size_;
			}
			return 0;
		}